

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::append_entries
          (raft_server *this,
          vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
          *logs)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar3;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ptr<async_result<bool>_> pVar5;
  ptr<req_msg> req;
  ptr<log_entry> log;
  value_type local_50;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  *local_40;
  raft_server *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  if (in_RDX[1] == *in_RDX) {
    this->_vptr_raft_server = (_func_int **)0x0;
    puVar3 = (undefined8 *)operator_new(0xa8);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_0017abd8;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    *(undefined1 *)(puVar3 + 5) = 1;
    puVar3[6] = 0;
    puVar3[7] = 0;
    puVar3[8] = 0;
    puVar3[9] = 0;
    puVar3[10] = 0;
    puVar3[0xb] = 0;
    puVar3[0xc] = 0;
    puVar3[0xd] = 0;
    puVar3[0xe] = 0;
    std::condition_variable::condition_variable((condition_variable *)(puVar3 + 0xf));
    *(undefined8 **)&this->leader_ = puVar3;
    this->_vptr_raft_server = (_func_int **)(puVar3 + 2);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    local_40 = logs;
    local_38 = this;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00178590;
    this_00[1]._M_use_count = 0;
    this_00[1]._M_weak_count = 0;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x5;
    this_00[2]._M_use_count = 0;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_001785e0;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[3]._M_use_count = 0;
    this_00[3]._M_weak_count = 0;
    this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[4]._M_use_count = 0;
    this_00[4]._M_weak_count = 0;
    this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[5]._M_use_count = 0;
    this_00[5]._M_weak_count = 0;
    puVar3 = (undefined8 *)*in_RDX;
    puVar1 = (undefined8 *)in_RDX[1];
    if (puVar3 != puVar1) {
      do {
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
        (local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count = 1;
        (local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_weak_count = 1;
        (local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00178648;
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 1);
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = 1;
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._vptr__Sp_counted_base = (_func_int **)*puVar3;
        uVar2 = puVar3[1];
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._M_use_count = (int)uVar2;
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
        puVar3[1] = 0;
        local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     *)&this_00[4]._M_use_count,&local_50);
        if (local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        puVar3 = puVar3 + 2;
      } while (puVar3 != puVar1);
    }
    this = local_38;
    pVar5 = send_msg_to_leader(local_38,(ptr<req_msg> *)local_40);
    _Var4 = pVar5.
            super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var4._M_pi = extraout_RDX;
    }
  }
  pVar5.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  pVar5.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<async_result<bool>_>)
         pVar5.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::append_entries(std::vector<bufptr>& logs)
{
    if (logs.size() == 0)
    {
        bool result(false);
        return cs_new<async_result<bool>>(result);
    }

    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::client_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    for (auto& item : logs)
    {
        ptr<log_entry> log(cs_new<log_entry>(0, std::move(item), log_val_type::app_log));
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req);
}